

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void kratos::check_direction(Port *port1,Port *port2,bool same_direction)

{
  initializer_list<const_kratos::IRNode_*> __l;
  PortDirection PVar1;
  VarException *this;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  allocator<const_kratos::IRNode_*> local_161;
  Port *local_160;
  Port *local_158;
  Port **local_150;
  size_type local_148;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_140;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_128;
  char local_f8 [32];
  string local_d8;
  PortDirection local_b4;
  PortDirection local_b0;
  PortDirection correct_dir;
  PortDirection port1_dir;
  bool same_direction_local;
  Port *port2_local;
  Port *port1_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_48) [51];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  correct_dir._3_1_ = same_direction;
  _port1_dir = port2;
  port2_local = port1;
  local_b0 = Port::port_direction(port1);
  local_b4 = local_b0;
  if ((correct_dir._3_1_ & 1) == In >> 0x18) {
    local_b4 = (PortDirection)(local_b0 == In);
  }
  PVar1 = Port::port_direction(_port1_dir);
  if (PVar1 != local_b4) {
    this = (VarException *)__cxa_allocate_exception(0x10);
    (*(port2_local->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_f8);
    (*(_port1_dir->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_128);
    local_38 = &local_d8;
    local_40 = "Port {0} and port {1} doesn\'t match port direction";
    local_48 = (char (*) [51])local_f8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[51],char>
              (&local_78,(v7 *)"Port {0} and port {1} doesn\'t match port direction",local_48,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&port1_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)port1_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_d8,(detail *)local_88.data_,format_str,args);
    local_160 = port2_local;
    local_158 = _port1_dir;
    local_150 = &local_160;
    local_148 = 2;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_161);
    __l._M_len = local_148;
    __l._M_array = (iterator)local_150;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_140,__l,&local_161);
    VarException::VarException(this,&local_d8,&local_140);
    __cxa_throw(this,&VarException::typeinfo,VarException::~VarException);
  }
  return;
}

Assistant:

void inline check_direction(const Port *port1, Port *port2, bool same_direction = false) {
    auto port1_dir = port1->port_direction();
    PortDirection correct_dir;
    if (same_direction)
        correct_dir = port1_dir;
    else if (port1_dir == PortDirection::In)
        correct_dir = PortDirection ::Out;
    else
        correct_dir = PortDirection ::In;
    if (port2->port_direction() != correct_dir) {
        throw VarException(::format("Port {0} and port {1} doesn't match port direction",
                                    port1->to_string(), port2->to_string()),
                           {port1, port2});
    }
}